

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int cmocka_run_group_fixture
              (char *function_name,CMFixtureFunction setup_func,CMFixtureFunction teardown_func,
              void **state,void *heap_check_point)

{
  long in_RSI;
  int rc;
  CMUnitTestFunction in_stack_00000038;
  char *in_stack_00000040;
  undefined4 local_2c;
  
  if (in_RSI == 0) {
    local_2c = cmocka_run_one_test_or_fixture
                         (in_stack_00000040,in_stack_00000038,(CMFixtureFunction)function_name,
                          setup_func,(void **)teardown_func,state);
  }
  else {
    local_2c = cmocka_run_one_test_or_fixture
                         (in_stack_00000040,in_stack_00000038,(CMFixtureFunction)function_name,
                          setup_func,(void **)teardown_func,state);
  }
  return local_2c;
}

Assistant:

static int cmocka_run_group_fixture(const char *function_name,
                                    CMFixtureFunction setup_func,
                                    CMFixtureFunction teardown_func,
                                    void **state,
                                    const void *const heap_check_point)
{
    int rc;

    if (setup_func != NULL) {
        rc = cmocka_run_one_test_or_fixture(function_name,
                                        NULL,
                                        setup_func,
                                        NULL,
                                        state,
                                        heap_check_point);
    } else {
        rc = cmocka_run_one_test_or_fixture(function_name,
                                        NULL,
                                        NULL,
                                        teardown_func,
                                        state,
                                        heap_check_point);
    }

    return rc;
}